

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O1

int read_os2_bminfoheader(ALLEGRO_FILE *f,BMPINFOHEADER *infoheader)

{
  char cVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  uVar3 = al_fread16le();
  uVar4 = al_fread16le(f);
  al_fread16le(f);
  uVar2 = al_fread16le(f);
  infoheader->biWidth = (ulong)uVar3 & 0xffff;
  infoheader->biHeight = (ulong)uVar4 & 0xffff;
  infoheader->biBitCount = uVar2;
  infoheader->biCompression = 0;
  infoheader->biClrUsed = 0;
  cVar1 = al_feof(f);
  if ((cVar1 == '\0') && (iVar5 = al_ferror(f), iVar5 == 0)) {
    return 0;
  }
  cVar1 = _al_trace_prefix("image",3,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/bmp.c"
                           ,0xb8,"read_os2_bminfoheader");
  if (cVar1 != '\0') {
    _al_trace_suffix("Failed to read file header\n");
  }
  return -1;
}

Assistant:

static int read_os2_bminfoheader(ALLEGRO_FILE *f, BMPINFOHEADER *infoheader)
{
   OS2BMPINFOHEADER os2_infoheader;

   os2_infoheader.biWidth = (uint16_t)al_fread16le(f);
   os2_infoheader.biHeight = (uint16_t)al_fread16le(f);
   os2_infoheader.biPlanes = (uint16_t)al_fread16le(f);
   os2_infoheader.biBitCount = (uint16_t)al_fread16le(f);

   infoheader->biWidth = os2_infoheader.biWidth;
   infoheader->biHeight = os2_infoheader.biHeight;
   infoheader->biBitCount = os2_infoheader.biBitCount;
   infoheader->biCompression = BIT_RGB;
   infoheader->biClrUsed = 0; /* default */

   if (al_feof(f) || al_ferror(f)) {
      ALLEGRO_ERROR("Failed to read file header\n");
      return -1;
   }

   return 0;
}